

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmarking.cpp
# Opt level: O3

void bench_compute_response_layer
               (vector<void_(*)(fasthessian_*),_std::allocator<void_(*)(fasthessian_*)>_> *functions
               ,integral_image *iimage,vector<benchmark_data,_std::allocator<benchmark_data>_> *data
               )

{
  fasthessian *fh;
  pointer pp_Var1;
  long lVar2;
  ulong uVar3;
  
  fh = create_fast_hessian(iimage);
  create_response_map(fh);
  pp_Var1 = (functions->
            super__Vector_base<void_(*)(fasthessian_*),_std::allocator<void_(*)(fasthessian_*)>_>).
            _M_impl.super__Vector_impl_data._M_start;
  if ((functions->
      super__Vector_base<void_(*)(fasthessian_*),_std::allocator<void_(*)(fasthessian_*)>_>)._M_impl
      .super__Vector_impl_data._M_finish != pp_Var1) {
    lVar2 = 0;
    uVar3 = 0;
    do {
      perf_compute_response_all_layers
                (pp_Var1[uVar3],fh,
                 (benchmark_data *)
                 (((data->super__Vector_base<benchmark_data,_std::allocator<benchmark_data>_>).
                   _M_impl.super__Vector_impl_data._M_start)->image_name + lVar2));
      pp_Var1 = (functions->
                super__Vector_base<void_(*)(fasthessian_*),_std::allocator<void_(*)(fasthessian_*)>_>
                )._M_impl.super__Vector_impl_data._M_start;
      uVar3 = uVar3 + 1;
      lVar2 = lVar2 + 0x238;
    } while (uVar3 < (ulong)((long)(functions->
                                   super__Vector_base<void_(*)(fasthessian_*),_std::allocator<void_(*)(fasthessian_*)>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)pp_Var1 >> 3)
            );
  }
  lVar2 = 1;
  do {
    free(fh->response_map[lVar2 + -1]->response);
    free(fh->response_map[lVar2 + -1]->laplacian);
    free(fh->response_map[lVar2 + -1]);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 5);
  free(fh);
  return;
}

Assistant:

void bench_compute_response_layer(const std::vector<void (*)(struct fasthessian *)> &functions,
                                  struct integral_image *iimage, std::vector<struct benchmark_data> &data) {
    // TODO: (carla) do we need a new fast hessian for every function?
    struct fasthessian *fh = create_fast_hessian(iimage);
    // Create octaves with response layers
    create_response_map(fh);

    assert(functions.size() == data.size());

    for (int j = 0; j < functions.size(); ++j) {
        perf_compute_response_all_layers(functions[j], fh, data[j]);
    }
    for (int i = 0; i < NUM_LAYERS; ++i) {
        free(fh->response_map[i]->response);
        free(fh->response_map[i]->laplacian);
        free(fh->response_map[i]);
    }
    free(fh);
}